

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbift3.cpp
# Opt level: O0

void CVmBifT3::get_source_info(uchar *entry_addr,ulong method_ofs,vm_val_t *retval)

{
  int iVar1;
  uint uVar2;
  vm_obj_id_t vVar3;
  CVmSrcfEntry *outbuf;
  CCharmapToUni *this;
  CVmObject *this_00;
  ulong uVar4;
  vm_val_t *in_RDX;
  uchar *in_RDI;
  size_t map_len;
  char *fname;
  CVmObjString *str;
  CVmSrcfEntry *srcf;
  vm_val_t ele;
  CVmObjList *lst;
  uchar *stm_end;
  uchar *stm_start;
  CVmDbgLinePtr line_ptr;
  CVmFuncPtr func_ptr;
  size_t in_stack_ffffffffffffff68;
  vm_val_t *this_01;
  char *in_stack_ffffffffffffff78;
  CCharmapToUni *input_str;
  CVmSrcfTable *in_stack_ffffffffffffff80;
  CCharmapToUni *in_stack_ffffffffffffff90;
  uchar **in_stack_ffffffffffffffa8;
  CVmSrcfEntry *this_02;
  uchar **in_stack_ffffffffffffffb0;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffb8;
  ulong in_stack_ffffffffffffffc0;
  CVmFuncPtr *in_stack_ffffffffffffffc8;
  CVmFuncPtr local_20;
  vm_val_t *local_18;
  uchar *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  CVmFuncPtr::CVmFuncPtr(&local_20);
  vm_val_t::set_nil(local_18);
  CVmFuncPtr::set(&local_20,local_8);
  iVar1 = CVmRun::get_stm_bounds
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (CVmDbgLinePtr *)in_stack_ffffffffffffffb8.native_desc,
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (iVar1 != 0) {
    if (G_srcf_table_X == (CVmSrcfTable *)0x0) {
      outbuf = (CVmSrcfEntry *)0x0;
    }
    else {
      in_stack_ffffffffffffff80 = G_srcf_table_X;
      uVar2 = CVmDbgLinePtr::get_source_id((CVmDbgLinePtr *)0x2a1cb9);
      outbuf = CVmSrcfTable::get_entry(in_stack_ffffffffffffff80,(ulong)uVar2);
    }
    if (outbuf != (CVmSrcfEntry *)0x0) {
      this_01 = local_18;
      this_02 = outbuf;
      vVar3 = CVmObjList::create((int)((ulong)local_18 >> 0x20),in_stack_ffffffffffffff68);
      vm_val_t::set_obj(this_01,vVar3);
      vm_objp(0);
      CVmObjList::cons_clear((CVmObjList *)this_01);
      CVmStack::push(local_18);
      CVmSrcfEntry::get_name(this_02);
      this = (CCharmapToUni *)
             CCharmapToUni::map_str
                       (in_stack_ffffffffffffff90,(char *)outbuf,(size_t)in_stack_ffffffffffffff80,
                        in_stack_ffffffffffffff78);
      vVar3 = CVmObjString::create((int)((ulong)this_01 >> 0x20),in_stack_ffffffffffffff68);
      vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffb0,vVar3);
      CVmObjList::cons_set_element
                ((CVmObjList *)this_01,in_stack_ffffffffffffff68,(vm_val_t *)0x2a1d99);
      this_00 = vm_objp(0);
      input_str = G_cmap_from_fname_X;
      CVmObjString::cons_get_buf((CVmObjString *)this_00);
      CCharmapToUni::map_str
                (this,(char *)outbuf,(size_t)in_stack_ffffffffffffff80,(char *)input_str);
      uVar4 = CVmDbgLinePtr::get_source_line((CVmDbgLinePtr *)0x2a1de1);
      vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffffb0,(int32_t)uVar4);
      CVmObjList::cons_set_element
                ((CVmObjList *)this_01,in_stack_ffffffffffffff68,(vm_val_t *)0x2a1e01);
      CVmStack::discard();
    }
  }
  return;
}

Assistant:

void CVmBifT3::get_source_info(VMG_ const uchar *entry_addr, ulong method_ofs,
                               vm_val_t *retval)
{
    CVmFuncPtr func_ptr;
    CVmDbgLinePtr line_ptr;
    const uchar *stm_start, *stm_end;
    CVmObjList *lst;
    vm_val_t ele;
    CVmSrcfEntry *srcf;
    CVmObjString *str;
    const char *fname;
    size_t map_len;

    /* presume we won't be able to find source information for the location */
    retval->set_nil();

    /* set up a debug table pointer for the function or method */
    func_ptr.set(entry_addr);

    /* get the debug information for the given location */
    if (!CVmRun::get_stm_bounds(vmg_ &func_ptr, method_ofs,
                                &line_ptr, &stm_start, &stm_end))
    {
        /* no source information available - return failure */
        return;
    }

    /* get the source file record - if we can't find it, return failure */
    srcf = (G_srcf_table != 0
            ? G_srcf_table->get_entry(line_ptr.get_source_id()) : 0);
    if (srcf == 0)
        return;

    /* 
     *   Create a list for the return value.  The return list has two
     *   elements: the name of the source file containing this code, and the
     *   line number in the file. 
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 2));
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* clear the list, in case gc runs during construction */
    lst->cons_clear();

    /* push the list for gc protection */
    G_stk->push(retval);

    /* get the filename string */
    fname = srcf->get_name();

    /* 
     *   determine how long the string will be when translated to utf8 from
     *   the local filename character set 
     */
    map_len = G_cmap_from_fname->map_str(0, 0, fname);

    /* 
     *   create a string value to hold the filename, and store it in the
     *   first element of the return list (note that this automatically
     *   protects the new string from garbage collection, by virtue of the
     *   list referencing the string and the list itself being protected) 
     */
    ele.set_obj(CVmObjString::create(vmg_ FALSE, map_len));
    lst->cons_set_element(0, &ele);

    /* map the string into the buffer we allocated for it */
    str = (CVmObjString *)vm_objp(vmg_ ele.val.obj);
    G_cmap_from_fname->map_str(str->cons_get_buf(), map_len, fname);

    /* set the second element of the list to the source line number */
    ele.set_int(line_ptr.get_source_line());
    lst->cons_set_element(1, &ele);

    /* discard our gc protection */
    G_stk->discard();
}